

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_parser_parser.cpp
# Opt level: O3

vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_> *
duckdb_libpgquery::keyword_list(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_> *in_RDI;
  long lVar2;
  PGKeyword keyword;
  value_type local_58;
  
  (in_RDI->
  super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 10;
  paVar1 = &local_58.text.field_2;
  do {
    local_58.text._M_string_length = 0;
    local_58.text.field_2._M_local_buf[0] = '\0';
    __s = *(char **)(&UNK_019b9f36 + lVar2);
    local_58.text._M_dataplus._M_p = (pointer)paVar1;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,(ulong)__s);
    if (*(ushort *)((long)&ScanKeywords + lVar2) < 4) {
      local_58.category = (PGKeywordCategory)*(ushort *)((long)&ScanKeywords + lVar2);
    }
    std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>::
    push_back(in_RDI,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.text._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.text._M_dataplus._M_p);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x1e3a);
  return in_RDI;
}

Assistant:

std::vector<PGKeyword> keyword_list() {
    std::vector<PGKeyword> result;
	for(size_t i = 0; i < NumScanKeywords; i++) {
		PGKeyword keyword;
		keyword.text = ScanKeywords[i].name;
		switch(ScanKeywords[i].category) {
		case UNRESERVED_KEYWORD:
			keyword.category = PGKeywordCategory::PG_KEYWORD_UNRESERVED;
			break;
		case RESERVED_KEYWORD:
			keyword.category = PGKeywordCategory::PG_KEYWORD_RESERVED;
			break;
		case TYPE_FUNC_NAME_KEYWORD:
			keyword.category = PGKeywordCategory::PG_KEYWORD_TYPE_FUNC;
			break;
		case COL_NAME_KEYWORD:
			keyword.category = PGKeywordCategory::PG_KEYWORD_COL_NAME;
			break;
		}
		result.push_back(keyword);
	}
	return result;
}